

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testBase64(void)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  undefined8 *puVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  Array<char,_axl::sl::ArrayDetails<char>_> dec;
  Array<char,_axl::sl::ArrayDetails<char>_> source;
  String enc;
  String enc_1;
  Array<char,_axl::sl::ArrayDetails<char>_> dec_1;
  char s [65];
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_110;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_f8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_d8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_b0;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_90;
  char local_78 [64];
  undefined1 local_38;
  
  puVar6 = &DAT_00156470;
  pcVar7 = local_78;
  for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    pcVar7 = pcVar7 + 8;
  }
  local_38 = 0;
  local_d8.m_length._0_1_ = 0;
  local_d8.m_length._1_7_ = 0;
  local_d8.m_isNullTerminated = false;
  local_d8.m_p = (C *)0x0;
  local_d8.m_hdr._0_1_ = 0;
  local_d8.m_hdr._1_7_ = 0;
  sVar3 = strlen(local_78);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_d8,(BufHdr *)0x0);
  local_d8.m_length._0_1_ = (undefined1)sVar3;
  local_d8.m_length._1_7_ = (undefined7)(sVar3 >> 8);
  local_d8.m_isNullTerminated = true;
  local_d8.m_p = local_78;
  axl::enc::Base64Encoding::decode
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_110,&local_d8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_d8);
  sVar8 = local_110.m_count;
  bVar1 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_110,local_110.m_count + 1);
  pcVar7 = local_110.m_p;
  if (bVar1) {
    if (local_110.m_p == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      local_110.m_p[sVar8] = '\0';
    }
  }
  printf("decoded: %s\n",pcVar7);
  axl::enc::Base64Encoding::encode((String *)&local_d8,local_110.m_p,local_110.m_count - 1,0);
  pcVar7 = local_d8.m_p;
  if (CONCAT71(local_d8.m_length._1_7_,(undefined1)local_d8.m_length) == 0) {
    pcVar7 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  iVar9 = 0;
  printf("encoded: %s\n",pcVar7);
  printf("orginal: %s\n",local_78);
  local_f8.m_p = (char *)0x0;
  local_f8.m_hdr = (Hdr *)0x0;
  local_f8.m_count = 0;
  do {
    iVar2 = rand();
    iVar2 = iVar2 % 0x40 + 0x10;
    sVar8 = (size_t)iVar2;
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
    setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_f8,sVar8);
    bVar1 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive
                      ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_f8);
    pcVar7 = (char *)0x0;
    if (bVar1) {
      pcVar7 = local_f8.m_p;
    }
    if (iVar2 != 0) {
      sVar5 = 0;
      do {
        iVar2 = rand();
        pcVar7[sVar5] = (char)iVar2;
        sVar5 = sVar5 + 1;
      } while (sVar8 != sVar5);
    }
    axl::enc::Base64Encoding::encode((String *)&local_b0,local_f8.m_p,sVar8,0);
    axl::enc::Base64Encoding::decode
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_90,&local_b0);
    axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_90);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_b0);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 500);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_f8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_d8);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_110);
  return;
}

Assistant:

void
testBase64() {
	char s[] = "aHVpLCBnb3ZubyBpIG11cmF2ZWk7IG11cmF2ZWksIGdvdm5vIGkgaHVpISEhIQ==";

	sl::Array<char> dec = enc::Base64Encoding::decode(s);
	dec.append(0);
	printf("decoded: %s\n", dec.cp());

	sl::String enc = enc::Base64Encoding::encode(dec, dec.getCount() - 1);
	printf("encoded: %s\n", enc.sz());
	printf("orginal: %s\n", s);
	ASSERT(enc == s);

	sl::Array<char> source;

	for (int i = 0; i < 500; i++) {
		size_t size = rand() % 64 + 16;
		source.setCount(size);
		sl::Array<char>::Rwi rwi = source;

		for (size_t j = 0; j < size; j++)
			rwi[j] = (char)rand();

		sl::String enc = enc::Base64Encoding::encode(source, size);
		sl::Array<char> dec = enc::Base64Encoding::decode(enc);
		ASSERT(dec.getCount() == size && memcmp(dec, source, size) == 0);
	}
}